

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

APInt * __thiscall llvm::APInt::operator*=(APInt *this,uint64_t RHS)

{
  APInt *pAVar1;
  uint srcParts;
  
  if ((ulong)this->BitWidth < 0x41) {
    (this->U).VAL = RHS * (this->U).VAL;
  }
  else {
    srcParts = (uint)((ulong)this->BitWidth + 0x3f >> 6);
    tcMultiplyPart((this->U).pVal,(this->U).pVal,RHS,0,srcParts,srcParts,false);
  }
  pAVar1 = clearUnusedBits(this);
  return pAVar1;
}

Assistant:

APInt& APInt::operator*=(uint64_t RHS) {
  if (isSingleWord()) {
    U.VAL *= RHS;
  } else {
    unsigned NumWords = getNumWords();
    tcMultiplyPart(U.pVal, U.pVal, RHS, 0, NumWords, NumWords, false);
  }
  return clearUnusedBits();
}